

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O3

bool __thiscall ObjectModelBuilder::build(ObjectModelBuilder *this,value *value)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  void *pvVar6;
  size_type *psVar7;
  string local_88;
  undefined1 local_68 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  i;
  
  i.second.u_._4_4_ = value->type_;
  if (i.second.u_._4_4_ == 5) {
    p_Var4 = *(_Rb_tree_node_base **)((long)&((value->u_).string_)->field_2 + 8);
    psVar7 = &((value->u_).string_)->_M_string_length;
    if (p_Var4 != (_Rb_tree_node_base *)psVar7) {
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                *)local_68,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                *)(p_Var4 + 1));
        iVar2 = std::__cxx11::string::compare((char *)local_68);
        if (((iVar2 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_68), iVar3 == 0))
           && (bVar1 = buildClasses(this,(value *)((long)&i.first.field_2 + 8),iVar2 == 0), !bVar1))
        {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"error: failed to build \'",0x18);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_68,(long)i.first._M_dataplus._M_p)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\', ",3);
          picojson::value::to_str_abi_cxx11_(&local_88,(value *)((long)&i.first.field_2 + 8));
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_88._M_dataplus._M_p,local_88._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if (i.first.field_2._8_4_ == 5) {
            if (i.second._0_8_ == 0) goto LAB_0010bd73;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                         *)i.second._0_8_);
          }
          else if (i.first.field_2._8_4_ == 4) {
            if (i.second._0_8_ == 0) goto LAB_0010bd73;
            std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                      ((vector<picojson::value,_std::allocator<picojson::value>_> *)i.second._0_8_);
          }
          else {
            if (i.first.field_2._8_4_ != 3) goto LAB_0010bc63;
            if (i.second._0_8_ == 0) {
LAB_0010bd73:
              i.second._0_8_ = (void *)0x0;
            }
            else if (*(void **)i.second._0_8_ != (void *)(i.second._0_8_ + 0x10)) {
              operator_delete(*(void **)i.second._0_8_);
            }
          }
          operator_delete((void *)i.second._0_8_);
          goto LAB_0010bc63;
        }
        pvVar6 = (void *)i.second._0_8_;
        if (i.first.field_2._8_4_ == 5) {
          if (i.second._0_8_ == 0) {
LAB_0010bbc6:
            pvVar6 = (void *)0x0;
          }
          else {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                         *)i.second._0_8_);
          }
LAB_0010bbc8:
          operator_delete(pvVar6);
        }
        else {
          if (i.first.field_2._8_4_ == 4) {
            if (i.second._0_8_ == 0) goto LAB_0010bbc6;
            std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                      ((vector<picojson::value,_std::allocator<picojson::value>_> *)i.second._0_8_);
            goto LAB_0010bbc8;
          }
          if (i.first.field_2._8_4_ == 3) {
            if (i.second._0_8_ == 0) goto LAB_0010bbc6;
            if (*(void **)i.second._0_8_ != (void *)(i.second._0_8_ + 0x10)) {
              operator_delete(*(void **)i.second._0_8_);
            }
            goto LAB_0010bbc8;
          }
        }
        if (local_68 != (undefined1  [8])&i.first._M_string_length) {
          operator_delete((void *)local_68);
        }
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      } while (p_Var4 != (_Rb_tree_node_base *)psVar7);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: toplevel json element is not a value",0x2b);
    picojson::value::to_str_abi_cxx11_((string *)local_68,value);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_68,(long)i.first._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
LAB_0010bc63:
    if (local_68 != (undefined1  [8])&i.first._M_string_length) {
      operator_delete((void *)local_68);
    }
  }
  return i.second.u_._4_4_ == 5;
}

Assistant:

bool ObjectModelBuilder::build(const picojson::value &value)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: toplevel json element is not a value" << value.to_str() << std::endl;
        return false;
    }

    bool ok = true;
    const picojson::object &object = value.get<picojson::object>();
    for (auto i : object) {
        if (i.first == "class-declarations") {
            ok = buildClasses(i.second, true);
        } else if (i.first == "classes") {
            ok = buildClasses(i.second, false);
        }

        if (!ok) {
            std::cerr << "error: failed to build '" << i.first << "', " << i.second.to_str() << std::endl;
            break;
        }
    }

    return true;
}